

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDebugServerConsole.cxx
# Opt level: O1

string * __thiscall
cmLineBufferStrategy::BufferMessage
          (string *__return_storage_ptr__,cmLineBufferStrategy *this,string *rawBuffer)

{
  ulong uVar1;
  pointer pcVar2;
  long lVar3;
  
  lVar3 = std::__cxx11::string::find((char)rawBuffer,10);
  if (lVar3 == -1) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)rawBuffer);
    uVar1 = __return_storage_ptr__->_M_string_length;
    if ((1 < uVar1) && ((__return_storage_ptr__->_M_dataplus)._M_p[uVar1 - 1] == '\r')) {
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,uVar1 - 1);
    }
    pcVar2 = (rawBuffer->_M_dataplus)._M_p;
    if (pcVar2 + rawBuffer->_M_string_length == pcVar2 + lVar3 + 1) {
      rawBuffer->_M_string_length = 0;
      *pcVar2 = '\0';
    }
    else {
      std::__cxx11::string::_M_erase((ulong)rawBuffer,0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BufferMessage(std::string& rawBuffer) override
  {
    auto needle = rawBuffer.find('\n');

    if (needle == std::string::npos) {
      return "";
    }
    std::string line = rawBuffer.substr(0, needle);
    const auto ls = line.size();
    if (ls > 1 && line.at(ls - 1) == '\r') {
      line.erase(ls - 1, 1);
    }
    rawBuffer.erase(rawBuffer.begin(),
                    rawBuffer.begin() + static_cast<long>(needle) + 1);
    return line;
  }